

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall amrex::Geometry::define(Geometry *this,Box *dom,RealBox *rb,int coord,int *is_per)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  CoordType CVar5;
  AMReX *this_00;
  Geometry *this_01;
  RealBox *__src;
  CoordType in_ECX;
  void *in_RDX;
  undefined8 *in_RSI;
  CoordType *in_RDI;
  long in_R8;
  int idim_1;
  int idim;
  Geometry *gg;
  int *in_stack_00000130;
  int in_stack_0000013c;
  RealBox *in_stack_00000140;
  int local_38;
  int local_34;
  
  Setup(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
  this_00 = AMReX::top();
  this_01 = AMReX::getDefaultGeometry(this_00);
  if (in_ECX == undef) {
    CVar5 = CoordSys::Coord(&this_01->super_CoordSys);
    *in_RDI = CVar5;
  }
  else {
    *in_RDI = in_ECX;
  }
  if (in_R8 == 0) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      bVar4 = isPeriodic(this_01,local_34);
      *(bool *)((long)in_RDI + (long)local_34 + 0x51) = bVar4;
    }
  }
  else {
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      *(bool *)((long)in_RDI + (long)local_38 + 0x51) = *(int *)(in_R8 + (long)local_38 * 4) != 0;
    }
  }
  if (in_RDX == (void *)0x0) {
    __src = ProbDomain(this_01);
    memcpy(in_RDI + 0x16,__src,0x30);
  }
  else {
    memcpy(in_RDI + 0x16,in_RDX,0x30);
  }
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = *(undefined8 *)((long)in_RSI + 0x14);
  *(undefined8 *)(in_RDI + 0x2e) = *(undefined8 *)((long)in_RSI + 0xc);
  *(undefined8 *)(in_RDI + 0x30) = uVar3;
  *(undefined8 *)(in_RDI + 0x2b) = uVar1;
  *(undefined8 *)(in_RDI + 0x2d) = uVar2;
  *(undefined1 *)(in_RDI + 0x14) = RZ;
  computeRoundoffDomain((Geometry *)rb);
  return;
}

Assistant:

void
Geometry::define (const Box& dom, const RealBox* rb, int coord,
                  int const* is_per) noexcept
{
    Setup(rb,coord,is_per);

    Geometry* gg = AMReX::top()->getDefaultGeometry();

    if (coord == -1) {
        c_sys = gg->Coord();
    } else {
        c_sys = static_cast<CoordType>(coord);
    }

    if (is_per == nullptr) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            is_periodic[idim] = gg->isPeriodic(idim);
        }
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            is_periodic[idim] = is_per[idim];
        }
    }

    if (rb == nullptr) {
        prob_domain = gg->ProbDomain();
    } else {
        prob_domain = *rb;
    }

    domain = dom;
    ok     = true;

    computeRoundoffDomain();
}